

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

void crnlib::SelectorNode::sort_task(uint64 data,void *ptr)

{
  std::__sort<unsigned_long_long*,__gnu_cxx::__ops::_Iter_less_iter>
            (*ptr,*(undefined8 *)((long)ptr + 8));
  return;
}

Assistant:

static void sort_task(uint64 data, void* ptr)
        {
            std::sort(((SelectorNode*)ptr)->p, ((SelectorNode*)ptr)->pEnd);
        }